

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O0

int MRIStepGetNumRhsEvals(void *arkode_mem,long *nfse_evals,long *nfsi_evals)

{
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  int retval;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  void *in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = mriStep_AccessStepMem
                      (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                       (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (ARKodeMRIStepMem *)0xee5d8e);
  if (local_4 == 0) {
    *in_RSI = *(undefined8 *)(in_stack_ffffffffffffffd0 + 0x168);
    *in_RDX = *(undefined8 *)(in_stack_ffffffffffffffd0 + 0x170);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int MRIStepGetNumRhsEvals(void *arkode_mem, long int *nfse_evals, long int *nfsi_evals)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "MRIStepGetNumRhsEvals",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* get number of fse and fsi evals from step_mem */
  *nfse_evals = step_mem->nfse;
  *nfsi_evals = step_mem->nfsi;

  return(ARK_SUCCESS);
}